

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nmTable.c
# Opt level: O0

int Nm_ManTableAdd(Nm_Man_t *p,Nm_Entry_t *pEntry)

{
  Nm_Entry_t **ppNVar1;
  uint uVar2;
  Nm_Entry_t *pNVar3;
  Nm_Entry_t *local_38;
  Nm_Entry_t *pOther;
  Nm_Entry_t **ppSpot;
  Nm_Entry_t *pEntry_local;
  Nm_Man_t *p_local;
  
  if (p->nBins * p->nSizeFactor < p->nEntries) {
    Nm_ManResize(p);
  }
  pNVar3 = Nm_ManTableLookupId(p,pEntry->ObjId);
  if (pNVar3 != (Nm_Entry_t *)0x0) {
    __assert_fail("Nm_ManTableLookupId(p, pEntry->ObjId) == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/nm/nmTable.c"
                  ,0x4e,"int Nm_ManTableAdd(Nm_Man_t *, Nm_Entry_t *)");
  }
  ppNVar1 = p->pBinsI2N;
  uVar2 = Nm_HashNumber(pEntry->ObjId,p->nBins);
  pEntry->pNextI2N = ppNVar1[uVar2];
  ppNVar1[uVar2] = pEntry;
  pNVar3 = Nm_ManTableLookupName(p,(char *)(pEntry + 1),-1);
  if (pNVar3 == (Nm_Entry_t *)0x0) {
    ppNVar1 = p->pBinsN2I;
    uVar2 = Nm_HashString((char *)(pEntry + 1),p->nBins);
    pEntry->pNextN2I = ppNVar1[uVar2];
    ppNVar1[uVar2] = pEntry;
  }
  else {
    local_38 = pNVar3;
    if (pNVar3->pNameSake != (Nm_Entry_t *)0x0) {
      local_38 = pNVar3->pNameSake;
    }
    pEntry->pNameSake = local_38;
    pNVar3->pNameSake = pEntry;
  }
  p->nEntries = p->nEntries + 1;
  return 1;
}

Assistant:

int Nm_ManTableAdd( Nm_Man_t * p, Nm_Entry_t * pEntry )
{
    Nm_Entry_t ** ppSpot, * pOther;
    // resize the tables if needed
    if ( p->nEntries > p->nBins * p->nSizeFactor )
        Nm_ManResize( p );
    // add the entry to the table Id->Name
    assert( Nm_ManTableLookupId(p, pEntry->ObjId) == NULL );
    ppSpot = p->pBinsI2N + Nm_HashNumber(pEntry->ObjId, p->nBins);
    pEntry->pNextI2N = *ppSpot;
    *ppSpot = pEntry;
    // check if an entry with the same name already exists
    if ( (pOther = Nm_ManTableLookupName(p, pEntry->Name, -1)) )
    {
        // entry with the same name already exists - add it to the ring
        pEntry->pNameSake = pOther->pNameSake? pOther->pNameSake : pOther;
        pOther->pNameSake = pEntry;
    }
    else
    {
        // entry with the same name does not exist - add it to the table
        ppSpot = p->pBinsN2I + Nm_HashString(pEntry->Name, p->nBins);
        pEntry->pNextN2I = *ppSpot;
        *ppSpot = pEntry;
    }
    // report successfully added entry
    p->nEntries++;
    return 1;
}